

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O3

c_v256 * c_v256_pack_s32_u16(c_v256 a,c_v256 b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  c_v256 cVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  c_v256 *in_RDI;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  
  auVar7 = vpinsrd_avx(ZEXT416(b.u32[3]),b.u32[6],1);
  auVar1 = vpinsrd_avx(ZEXT416(b.u32[2]),b.u32[7],1);
  auVar1 = vpinsrd_avx(auVar1,a.u32[2],2);
  auVar7 = vpinsrd_avx(auVar7,a.u32[3],2);
  auVar7 = vpinsrd_avx(auVar7,a.u32[6],3);
  auVar1 = vpinsrd_avx(auVar1,a.u32[7],3);
  auVar2 = vpinsrq_avx((undefined1  [16])b.v128[0],b.u64[2],1);
  auVar9._8_8_ = a.u64[0];
  auVar9._0_8_ = a._0_8_;
  auVar9._16_8_ = a.u64[0];
  auVar9._24_8_ = a.u64[0];
  auVar10._8_8_ = a.u64[2];
  auVar10._0_8_ = a._16_8_;
  auVar10._16_8_ = a.u64[2];
  auVar10._24_8_ = a.u64[2];
  auVar9 = vunpcklpd_avx(auVar9,auVar10);
  auVar3 = vshufps_avx(auVar2,auVar9._16_16_,0x88);
  auVar2 = vshufps_avx(auVar2,auVar9._16_16_,0xdd);
  auVar8 = ZEXT816(0) << 0x20;
  auVar7 = vpmaxsd_avx(auVar7,auVar8);
  auVar11._8_4_ = 0xffff;
  auVar11._0_8_ = 0xffff0000ffff;
  auVar11._12_4_ = 0xffff;
  auVar7 = vpminsd_avx(auVar7,auVar11);
  auVar9 = vpmovzxdq_avx2(auVar7);
  auVar7 = vpmaxsd_avx(auVar1,auVar8);
  auVar7 = vpminsd_avx(auVar7,auVar11);
  auVar10 = vpmovzxdq_avx2(auVar7);
  auVar7 = vpmaxsd_avx(auVar2,auVar8);
  auVar1 = vpminsd_avx(auVar7,auVar11);
  auVar7 = vpmaxsd_avx(auVar3,auVar8);
  auVar7 = vpminsd_avx(auVar7,auVar11);
  auVar5 = vpsllvq_avx2(auVar9,_DAT_00bf1460);
  auVar6 = vpsllvq_avx2(auVar10,_DAT_00bf1480);
  auVar9 = vpmovzxdq_avx2(auVar7);
  auVar7 = vpslld_avx(auVar1,0x10);
  auVar10 = vpmovzxdq_avx2(auVar7);
  auVar10 = vpor_avx2(auVar6,auVar10);
  auVar10 = vpor_avx2(auVar10,auVar5);
  cVar4 = (c_v256)vpor_avx2(auVar10,auVar9);
  *in_RDI = cVar4;
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_pack_s32_u16(c_v256 a, c_v256 b) {
  return c_v256_from_v128(c_v128_pack_s32_u16(a.v128[1], a.v128[0]),
                          c_v128_pack_s32_u16(b.v128[1], b.v128[0]));
}